

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmInstallTargetGenerator::GetDestination
          (string *__return_storage_ptr__,cmInstallTargetGenerator *this,string *config)

{
  cmCommandContext *this_00;
  Snapshot snapshot;
  PositionType config_00;
  cmCompiledGeneratorExpression *this_01;
  cmLocalGenerator *lg;
  char *pcVar1;
  allocator local_119;
  string local_118;
  cmGeneratorExpression local_f8;
  Snapshot local_b8;
  cmListFileBacktrace local_a0;
  undefined1 local_60 [8];
  cmGeneratorExpression ge;
  string *config_local;
  cmInstallTargetGenerator *this_local;
  
  ge.Backtrace.Snapshot.Position.Position = (PositionType)config;
  cmState::Snapshot::Snapshot(&local_b8,(cmState *)0x0);
  this_00 = (cmCommandContext *)((long)&local_f8.Backtrace.Context.Name.field_2 + 8);
  cmCommandContext::cmCommandContext(this_00);
  snapshot.Position.Tree = local_b8.Position.Tree;
  snapshot.State = local_b8.State;
  snapshot.Position.Position = local_b8.Position.Position;
  cmListFileBacktrace::cmListFileBacktrace(&local_a0,snapshot,this_00);
  cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_60,&local_a0);
  cmListFileBacktrace::~cmListFileBacktrace(&local_a0);
  cmCommandContext::~cmCommandContext
            ((cmCommandContext *)((long)&local_f8.Backtrace.Context.Name.field_2 + 8));
  cmGeneratorExpression::Parse(&local_f8,(string *)local_60);
  this_01 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->
                      ((auto_ptr<cmCompiledGeneratorExpression> *)&local_f8);
  lg = cmGeneratorTarget::GetLocalGenerator(this->Target);
  config_00 = ge.Backtrace.Snapshot.Position.Position;
  std::__cxx11::string::string((string *)&local_118);
  pcVar1 = cmCompiledGeneratorExpression::Evaluate
                     (this_01,lg,(string *)config_00,false,(cmGeneratorTarget *)0x0,
                      (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,&local_118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_119);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  std::__cxx11::string::~string((string *)&local_118);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)&local_f8);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string
cmInstallTargetGenerator::GetDestination(std::string const& config) const
{
  cmGeneratorExpression ge;
  return ge.Parse(this->Destination)
    ->Evaluate(this->Target->GetLocalGenerator(), config);
}